

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.c
# Opt level: O3

int opus_picture_tag_parse(OpusPictureTag *_pic,char *_tag)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  size_t sVar6;
  uint *__dest;
  char *_a;
  char *__dest_00;
  uchar *puVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  long *_buf;
  long lVar13;
  long lVar14;
  uint uVar15;
  uint uVar16;
  char *__s;
  opus_uint32 local_88;
  opus_uint32 local_84;
  int local_68;
  int local_54;
  opus_uint32 local_50;
  opus_uint32 local_4c;
  opus_uint32 local_48;
  opus_uint32 local_44;
  long local_40;
  OpusPictureTag *local_38;
  ulong __n;
  
  iVar3 = op_strncasecmp("METADATA_BLOCK_PICTURE",_tag,0x16);
  if (iVar3 == 0) {
    lVar13 = 0x17;
    if (_tag[0x16] != '=') {
      lVar13 = 0;
    }
  }
  else {
    lVar13 = 0;
  }
  __s = _tag + lVar13;
  sVar6 = strlen(__s);
  if ((sVar6 & 3) != 0) {
    return -0x84;
  }
  if (sVar6 < 0x2c) {
    return -0x84;
  }
  uVar11 = ((sVar6 >> 2) * 3 - (ulong)(__s[sVar6 - 1] == '=')) - (ulong)(__s[sVar6 - 2] == '=');
  if (uVar11 < 0x20) {
    return -0x84;
  }
  __dest = (uint *)malloc(uVar11 + 1);
  if (__dest == (uint *)0x0) {
    return -0x81;
  }
  lVar13 = 0;
  uVar9 = 0;
  iVar3 = -0x84;
  do {
    lVar14 = uVar9 * 3;
    lVar12 = 0;
    uVar10 = 0;
    do {
      bVar1 = __s[lVar12];
      local_38 = _pic;
      if (bVar1 == 0x2b) {
        uVar4 = 0x3e;
      }
      else if (bVar1 == 0x2f) {
        uVar4 = 0x3f;
      }
      else {
        uVar15 = (uint)bVar1;
        if ((byte)(bVar1 - 0x30) < 10) {
          uVar4 = uVar15 + 4;
        }
        else if ((byte)(bVar1 + 0x9f) < 0x1a) {
          uVar4 = uVar15 - 0x47;
        }
        else if ((byte)(bVar1 + 0xbf) < 0x1a) {
          uVar4 = uVar15 - 0x41;
        }
        else {
          __dest_00 = (char *)0x0;
          uVar4 = 0;
          if (uVar15 != 0x3d) goto LAB_0010a3c3;
          _a = (char *)0x0;
          if ((ulong)(lVar13 + lVar12) <= uVar11) goto LAB_0010a3c5;
        }
      }
      uVar10 = uVar10 << 6 | uVar4;
      lVar12 = lVar12 + 1;
    } while (lVar12 != 4);
    *(char *)((long)__dest + lVar14) = (char)(uVar10 >> 0x10);
    if (lVar14 + 1U < uVar11) {
      *(char *)((long)__dest + lVar14 + 1) = (char)(uVar10 >> 8);
      if (lVar14 + 2U < uVar11) {
        *(char *)((long)__dest + lVar14 + 2U) = (char)uVar10;
      }
    }
    uVar9 = uVar9 + 1;
    lVar13 = lVar13 + 3;
    __s = __s + 4;
  } while (uVar9 != sVar6 >> 2);
  uVar10 = __dest[1];
  uVar10 = uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 | uVar10 << 0x18;
  uVar9 = (ulong)uVar10;
  iVar3 = -0x84;
  if (uVar11 - 0x20 < uVar9) {
LAB_0010a3c3:
    __dest_00 = (char *)0x0;
    iVar3 = -0x84;
    _a = (char *)0x0;
    goto LAB_0010a3c5;
  }
  uVar4 = *__dest;
  _a = (char *)malloc((ulong)(uVar10 + 1));
  if (_a == (char *)0x0) {
    __dest_00 = (char *)0x0;
    _a = (char *)0x0;
    iVar3 = -0x81;
    goto LAB_0010a3c5;
  }
  memcpy(_a,__dest + 2,uVar9);
  _a[uVar9] = '\0';
  uVar15 = *(uint *)((long)__dest + uVar9 + 8);
  uVar15 = uVar15 >> 0x18 | (uVar15 & 0xff0000) >> 8 | (uVar15 & 0xff00) << 8 | uVar15 << 0x18;
  __n = (ulong)uVar15;
  if ((uVar11 - 0x20) - uVar9 < __n) {
    __dest_00 = (char *)0x0;
    goto LAB_0010a3c5;
  }
  __dest_00 = (char *)malloc((ulong)(uVar15 + 1));
  if (__dest_00 == (char *)0x0) {
    __dest_00 = (char *)0x0;
    goto LAB_0010a5ad;
  }
  memcpy(__dest_00,(void *)((long)__dest + uVar9 + 0xc),__n);
  __dest_00[__n] = '\0';
  lVar13 = uVar9 + 0xc + __n;
  uVar15 = *(uint *)((long)__dest + lVar13);
  uVar8 = *(uint *)((long)__dest + lVar13 + 4);
  uVar16 = uVar15 >> 0x18 | (uVar15 & 0xff0000) >> 8 | (uVar15 & 0xff00) << 8 | uVar15 << 0x18;
  local_88 = uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18;
  uVar15 = *(uint *)((long)__dest + lVar13 + 8);
  local_84 = uVar15 >> 0x18 | (uVar15 & 0xff0000) >> 8 | (uVar15 & 0xff00) << 8 | uVar15 << 0x18;
  uVar15 = *(uint *)((long)__dest + lVar13 + 0xc);
  uVar15 = uVar15 >> 0x18 | (uVar15 & 0xff0000) >> 8 | (uVar15 & 0xff00) << 8 | uVar15 << 0x18;
  if ((local_84 == 0 || (local_88 == 0 || uVar16 == 0)) &&
     (((uVar16 != 0 || local_88 != 0) || local_84 != 0) || uVar15 != 0)) goto LAB_0010a3c5;
  uVar8 = *(uint *)((long)__dest + lVar13 + 0x10);
  uVar8 = uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18;
  uVar9 = (ulong)uVar8;
  lVar14 = lVar13 + 0x14;
  if (uVar11 - lVar14 < uVar9) goto LAB_0010a3c5;
  uVar4 = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
  local_40 = lVar14 + uVar9;
  local_68 = -1;
  bVar2 = true;
  switch(uVar10) {
  case 0:
switchD_0010a540_caseD_0:
    _buf = (long *)((long)__dest + lVar14);
    if (2 < uVar8) {
      if (*(char *)((long)_buf + 2) == -1 && (short)*_buf == -0x2701) goto LAB_0010a7ac;
      if ((7 < uVar8) && (*_buf == 0xa1a0a0d474e5089)) goto LAB_0010a86b;
    }
    iVar5 = op_is_gif((uchar *)_buf,uVar9);
joined_r0x0010a742:
    if (iVar5 == 0) {
LAB_0010a83a:
      bVar2 = true;
    }
    else {
      local_50 = 0;
      local_4c = 0;
      local_48 = 0;
      local_44 = 0;
      local_54 = -1;
      puVar7 = (uchar *)((long)__dest + lVar14);
      iVar5 = op_is_gif(puVar7,uVar9);
      bVar2 = true;
      local_68 = 3;
      if ((uVar8 < 0xe) || (iVar5 == 0)) goto LAB_0010a8c1;
      local_68 = 3;
      bVar2 = true;
      uVar16 = (uint)*(ushort *)(puVar7 + 6);
      local_88 = (uint)*(ushort *)(puVar7 + 8);
      local_84 = 0x18;
      uVar15 = 1 << (puVar7[10] & 7) + 1;
    }
    break;
  case 3:
    iVar5 = strcmp(_a,"-->");
    if (iVar5 != 0) goto LAB_0010a83a;
    if ((uVar4 == 1 && (uVar16 != 0 || local_88 != 0)) && ((uVar16 != 0x20 || (local_88 != 0x20))))
    goto LAB_0010a3c5;
    *(undefined1 *)((long)__dest + local_40) = 0;
    local_40 = local_40 + 1;
    local_68 = 0;
    goto LAB_0010a94f;
  case 6:
    iVar5 = op_strncasecmp(_a,"image/",6);
    bVar2 = true;
    if (iVar5 == 0) goto switchD_0010a540_caseD_0;
    break;
  case 9:
    iVar5 = op_strncasecmp(_a,"image/png",9);
    if (iVar5 != 0) {
      iVar5 = op_strncasecmp(_a,"image/gif",9);
      if (iVar5 != 0) goto LAB_0010a84d;
      iVar5 = op_is_gif((uchar *)((long)__dest + lVar14),uVar9);
      goto joined_r0x0010a742;
    }
    if (uVar8 < 8) {
LAB_0010a84d:
      bVar2 = true;
      break;
    }
    if (*(long *)((long)__dest + lVar14) != 0xa1a0a0d474e5089) goto LAB_0010a83a;
LAB_0010a86b:
    local_50 = 0;
    local_4c = 0;
    local_48 = 0;
    bVar2 = false;
    local_44 = 0;
    local_54 = -1;
    op_extract_png_params
              ((uchar *)((long)__dest + lVar14),uVar9,&local_44,&local_48,&local_4c,&local_50,
               &local_54);
    local_68 = 2;
    goto LAB_0010a8c1;
  case 10:
    iVar5 = op_strncasecmp(_a,"image/jpeg",10);
    if (((uVar8 < 3) || (iVar5 != 0)) ||
       (*(char *)((long)__dest + lVar13 + 0x16) != -1 ||
        *(short *)((long)__dest + lVar14) != -0x2701)) goto LAB_0010a83a;
LAB_0010a7ac:
    local_50 = 0;
    local_4c = 0;
    local_48 = 0;
    local_44 = 0;
    local_54 = -1;
    op_extract_jpeg_params
              ((uchar *)((long)__dest + lVar14),uVar9,&local_44,&local_48,&local_4c,&local_50,
               &local_54);
    bVar2 = true;
    local_68 = 1;
LAB_0010a8c1:
    if (-1 < local_54) {
      uVar16 = local_44;
      local_88 = local_48;
      local_84 = local_4c;
      uVar15 = local_50;
    }
  }
  if (uVar4 == 1) {
    if ((bVar2 || uVar16 != 0x20) || (local_88 != 0x20)) goto LAB_0010a3c5;
    local_68 = 2;
    uVar16 = 0x20;
    local_88 = 0x20;
  }
LAB_0010a94f:
  lVar13 = local_40;
  sVar6 = local_40 - lVar14;
  memmove(__dest,(void *)((long)__dest + lVar14),sVar6);
  puVar7 = (uchar *)realloc(__dest,sVar6);
  if ((lVar13 == lVar14) || (puVar7 != (uchar *)0x0)) {
    local_38->type = uVar4;
    *(undefined4 *)&local_38->field_0x4 = 0;
    local_38->mime_type = _a;
    local_38->description = __dest_00;
    local_38->width = uVar16;
    local_38->height = local_88;
    local_38->depth = local_84;
    local_38->colors = uVar15;
    local_38->data_length = uVar8;
    *(undefined4 *)&local_38->field_0x2c = 0;
    local_38->data = puVar7;
    local_38->format = local_68;
    *(undefined4 *)&local_38->field_0x3c = 0;
    return 0;
  }
LAB_0010a5ad:
  iVar3 = -0x81;
LAB_0010a3c5:
  free(__dest_00);
  free(_a);
  free(__dest);
  return iVar3;
}

Assistant:

int opus_picture_tag_parse(OpusPictureTag *_pic,const char *_tag){
  OpusPictureTag  pic;
  unsigned char  *buf;
  size_t          base64_sz;
  size_t          buf_sz;
  size_t          tag_length;
  int             ret;
  if(opus_tagncompare("METADATA_BLOCK_PICTURE",22,_tag)==0)_tag+=23;
  /*Figure out how much BASE64-encoded data we have.*/
  tag_length=strlen(_tag);
  if(tag_length&3)return OP_ENOTFORMAT;
  base64_sz=tag_length>>2;
  buf_sz=3*base64_sz;
  if(buf_sz<32)return OP_ENOTFORMAT;
  if(_tag[tag_length-1]=='=')buf_sz--;
  if(_tag[tag_length-2]=='=')buf_sz--;
  if(buf_sz<32)return OP_ENOTFORMAT;
  /*Allocate an extra byte to allow appending a terminating NUL to URL data.*/
  buf=(unsigned char *)_ogg_malloc(sizeof(*buf)*(buf_sz+1));
  if(buf==NULL)return OP_EFAULT;
  opus_picture_tag_init(&pic);
  ret=opus_picture_tag_parse_impl(&pic,_tag,buf,buf_sz,base64_sz);
  if(ret<0){
    opus_picture_tag_clear(&pic);
    _ogg_free(buf);
  }
  else *_pic=*&pic;
  return ret;
}